

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::growAtomicCounterBlock
          (TParseContext *this,int binding,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *typeList)

{
  TIntermediate *this_00;
  uint uVar1;
  int iVar2;
  TBlockStorageClass newBacking;
  mapped_type *ppTVar3;
  undefined4 extraout_var;
  TQualifier *pTVar4;
  undefined4 extraout_var_00;
  TBlockStorageClass storageOverride;
  TQualifier *qualifier;
  _Self local_48;
  byte local_39;
  TTypeList *pTStack_38;
  bool createBlock;
  TTypeList *typeList_local;
  TString *memberName_local;
  TType *memberType_local;
  TSourceLoc *loc_local;
  TParseContext *pTStack_10;
  int binding_local;
  TParseContext *this_local;
  
  pTStack_38 = typeList;
  typeList_local = (TTypeList *)memberName;
  memberName_local = (TString *)memberType;
  memberType_local = (TType *)loc;
  loc_local._4_4_ = binding;
  pTStack_10 = this;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
       ::find(&(this->super_TParseContextBase).atomicCounterBuffers.
               super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
              ,(key_type_conflict1 *)((long)&loc_local + 4));
  qualifier = (TQualifier *)
              std::
              map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
              ::end(&(this->super_TParseContextBase).atomicCounterBuffers.
                     super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                   );
  local_39 = std::operator==(&local_48,(_Self *)&qualifier);
  if ((bool)local_39) {
    uVar1 = TIntermediate::getAtomicCounterBlockSet
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    (this->super_TParseContextBase).atomicCounterBlockSet = uVar1;
  }
  TParseContextBase::growAtomicCounterBlock
            (&this->super_TParseContextBase,loc_local._4_4_,(TSourceLoc *)memberType_local,
             (TType *)memberName_local,(TString *)typeList_local,pTStack_38);
  ppTVar3 = std::
            map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
            ::operator[](&(this->super_TParseContextBase).atomicCounterBuffers.
                          super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                         ,(key_type_conflict1 *)((long)&loc_local + 4));
  iVar2 = (*((*ppTVar3)->super_TSymbol)._vptr_TSymbol[0xd])();
  pTVar4 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))();
  *(ulong *)&pTVar4->field_0x8 = *(ulong *)&pTVar4->field_0x8 & 0xfffffff7ffffffff | 0x800000000;
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) != 0)) {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x48])();
    newBacking = TIntermediate::getBlockStorageOverride
                           (this_00,(char *)CONCAT44(extraout_var_00,iVar2));
    if (newBacking != EbsNone) {
      if ((local_39 & 1) != 0) {
        TQualifier::setBlockStorage(pTVar4,newBacking);
        blockQualifierCheck(this,(TSourceLoc *)memberType_local,pTVar4,false);
      }
      pTVar4 = (TQualifier *)
               (**(code **)&((memberName_local->_M_dataplus).super_allocator_type.allocator)->
                            numCalls)();
      TQualifier::setBlockStorage(pTVar4,newBacking);
    }
  }
  return;
}

Assistant:

void TParseContext::growAtomicCounterBlock(int binding, const TSourceLoc& loc, TType& memberType, const TString& memberName, TTypeList* typeList)
{
    bool createBlock = atomicCounterBuffers.find(binding) == atomicCounterBuffers.end();

    if (createBlock) {
        atomicCounterBlockSet = intermediate.getAtomicCounterBlockSet();
    }

    // use base class function to create/expand block
    TParseContextBase::growAtomicCounterBlock(binding, loc, memberType, memberName, typeList);
    TQualifier& qualifier = atomicCounterBuffers[binding]->getWritableType().getQualifier();
    qualifier.defaultBlock = true;

    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        // check for a Block storage override
        TBlockStorageClass storageOverride = intermediate.getBlockStorageOverride(getAtomicCounterBlockName());

        if (storageOverride != EbsNone) {
            if (createBlock) {
                // Remap block storage

                qualifier.setBlockStorage(storageOverride);

                // check that the change didn't create errors
                blockQualifierCheck(loc, qualifier, false);
            }

            // remap meber storage as well
            memberType.getQualifier().setBlockStorage(storageOverride);
        }
    }
}